

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchInstanceBufferUpload::iterate
          (TestStatus *__return_storage_ptr__,IndirectDispatchInstanceBufferUpload *this)

{
  pointer *ppWVar1;
  TestContext *pTVar2;
  TestLog *log;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  Allocator *pAVar5;
  void *pvVar6;
  pointer pDVar7;
  pointer pDVar8;
  ProgramCollection<vk::ProgramBinary> *this_00;
  bool bVar9;
  MessageBuilder *pMVar10;
  InstanceInterface *pIVar11;
  VkPhysicalDevice pVVar12;
  VkDeviceSize VVar13;
  ProgramBinary *binary;
  DescriptorPoolBuilder *this_01;
  Unique<vk::Handle<(vk::HandleType)22>_> *ptr;
  ulong uVar14;
  TestStatus *pTVar15;
  VkDeviceSize VVar16;
  VkDeviceSize bufferSize;
  long lVar17;
  uint uVar18;
  RefBase<vk::VkCommandBuffer_s_*> local_578;
  TestStatus *local_550;
  VkDescriptorBufferInfo resultDescriptorInfo;
  Location local_530;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  descriptorSets;
  VkBufferMemoryBarrier ssboPostBarrier;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_4d8;
  Buffer resultBuffer;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_488;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_468;
  DescriptorSetLayoutBuilder layoutBuilder;
  Buffer indirectBuffer;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_3c8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_3a8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_388;
  DescriptorSetUpdateBuilder descriptorSetBuilder;
  ulong local_f8;
  
  pTVar2 = this->m_context->m_testCtx;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar2->m_log;
  ppWVar1 = &descriptorSetBuilder.m_writeDescriptorInfos.
             super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppWVar1);
  std::operator<<((ostream *)ppWVar1,"GL_DISPATCH_INDIRECT_BUFFER size = ");
  pMVar10 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&descriptorSetBuilder,&this->m_bufferSize);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppWVar1);
  log = pTVar2->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&descriptorSetBuilder,"Commands",(allocator<char> *)&local_4d8);
  local_468.m_data.object.m_internal =
       ((long)(this->m_dispatchCommands).
              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_dispatchCommands).
             super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  de::toString<unsigned_long>((string *)&resultBuffer,(unsigned_long *)&local_468);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ssboPostBarrier,"Indirect Dispatch Commands (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultBuffer)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&layoutBuilder
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &ssboPostBarrier," in total)");
  local_550 = __return_storage_ptr__;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&indirectBuffer,log,(string *)&descriptorSetBuilder,
             (string *)&layoutBuilder);
  std::__cxx11::string::~string((string *)&layoutBuilder);
  std::__cxx11::string::~string((string *)&ssboPostBarrier);
  std::__cxx11::string::~string((string *)&resultBuffer);
  std::__cxx11::string::~string((string *)&descriptorSetBuilder);
  ppWVar1 = &descriptorSetBuilder.m_writeDescriptorInfos.
             super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar18 = 0; uVar14 = (ulong)uVar18,
      uVar14 < (ulong)(((long)(this->m_dispatchCommands).
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_dispatchCommands).
                             super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar18 = uVar18 + 1
      ) {
    descriptorSetBuilder.m_writeDescriptorInfos.
    super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar2->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppWVar1);
    std::ostream::_M_insert<unsigned_long>((ulong)ppWVar1);
    std::operator<<((ostream *)ppWVar1,": ");
    std::operator<<((ostream *)ppWVar1,"offset = ");
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&descriptorSetBuilder,
                         &(this->m_dispatchCommands).
                          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14].m_offset);
    std::operator<<((ostream *)&pMVar10->m_str,", numWorkGroups = ");
    tcu::operator<<((ostream *)&pMVar10->m_str,
                    &(this->m_dispatchCommands).
                     super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].m_numWorkGroups);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppWVar1);
  }
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&indirectBuffer);
  pIVar11 = Context::getInstanceInterface(this->m_context);
  pVVar12 = Context::getPhysicalDevice(this->m_context);
  (*pIVar11->_vptr_InstanceInterface[5])(pIVar11,pVVar12,&descriptorSetBuilder);
  VVar13 = 0x10;
  if ((local_f8 != 0) && (0x10U % local_f8 != 0)) {
    VVar13 = (0x10 / local_f8 + 1) * local_f8;
  }
  bufferSize = (((long)(this->m_dispatchCommands).
                       super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffffU) * VVar13;
  pDVar3 = this->m_device_interface;
  pVVar4 = this->m_device;
  pAVar5 = this->m_allocator;
  makeBufferCreateInfo((VkBufferCreateInfo *)&descriptorSetBuilder,bufferSize,0x20);
  compute::Buffer::Buffer
            (&resultBuffer,pDVar3,pVVar4,pAVar5,(VkBufferCreateInfo *)&descriptorSetBuilder,
             (MemoryRequirement)0x1);
  pvVar6 = (resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  pDVar7 = (this->m_dispatchCommands).
           super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar8 = (this->m_dispatchCommands).
           super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar18 = 0; uVar14 = (ulong)uVar18, uVar14 < (ulong)(((long)pDVar8 - (long)pDVar7) / 0x18);
      uVar18 = uVar18 + 1) {
    lVar17 = VVar13 * uVar14;
    *(uint *)((long)pvVar6 + lVar17) = pDVar7[uVar14].m_numWorkGroups.m_data[0];
    *(uint *)((long)pvVar6 + lVar17 + 4) = pDVar7[uVar14].m_numWorkGroups.m_data[1];
    *(uint *)((long)pvVar6 + lVar17 + 8) = pDVar7[uVar14].m_numWorkGroups.m_data[2];
    *(undefined4 *)((long)pvVar6 + lVar17 + 0xc) = 0;
  }
  ::vk::flushMappedMemoryRange
            (this->m_device_interface,this->m_device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  pDVar3 = this->m_device_interface;
  pVVar4 = this->m_device;
  this_00 = this->m_context->m_progCollection;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ssboPostBarrier,"indirect_dispatch_",&this->m_name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&layoutBuilder
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &ssboPostBarrier,"_verify");
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&layoutBuilder);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&descriptorSetBuilder,pDVar3,pVVar4,binary,0);
  local_468.m_data.deleter.m_device =
       (VkDevice)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_468.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       descriptorSetBuilder.m_writes.
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_468.m_data.object.m_internal =
       (deUint64)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_468.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorSetBuilder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&descriptorSetBuilder);
  std::__cxx11::string::~string((string *)&layoutBuilder);
  std::__cxx11::string::~string((string *)&ssboPostBarrier);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&layoutBuilder);
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            (&layoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetBuilder,&layoutBuilder,
             this->m_device_interface,this->m_device,0);
  local_4d8.m_data.deleter.m_device =
       (VkDevice)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4d8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       descriptorSetBuilder.m_writes.
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4d8.m_data.object.m_internal =
       (deUint64)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4d8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorSetBuilder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetBuilder);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&descriptorSetBuilder,
                     this->m_device_interface,this->m_device,
                     (VkDescriptorSetLayout)local_4d8.m_data.object.m_internal);
  local_488.m_data.deleter.m_device =
       (VkDevice)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_488.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       descriptorSetBuilder.m_writes.
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_488.m_data.object.m_internal =
       (deUint64)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorSetBuilder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&descriptorSetBuilder);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&descriptorSetBuilder,
                      this->m_device_interface,this->m_device,
                      (VkPipelineLayout)local_488.m_data.object.m_internal,
                      (VkShaderModule)local_468.m_data.object.m_internal);
  local_388.m_data.deleter.m_device =
       (VkDevice)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_388.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       descriptorSetBuilder.m_writes.
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_388.m_data.object.m_internal =
       (deUint64)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_388.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorSetBuilder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&descriptorSetBuilder);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&ssboPostBarrier);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&ssboPostBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (deUint32)
                       (((long)(this->m_dispatchCommands).
                               super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_dispatchCommands).
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&descriptorSetBuilder,this_01,
             this->m_device_interface,this->m_device,1,
             (deUint32)
             (((long)(this->m_dispatchCommands).
                     super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_dispatchCommands).
                    super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18));
  local_3a8.m_data.deleter.m_device =
       (VkDevice)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3a8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       descriptorSetBuilder.m_writes.
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3a8.m_data.object.m_internal =
       (deUint64)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3a8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorSetBuilder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&descriptorSetBuilder);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&ssboPostBarrier);
  makeBufferMemoryBarrier
            (&ssboPostBarrier,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&descriptorSetBuilder,
                  this->m_device_interface,this->m_device,this->m_queueFamilyIndex);
  local_3c8.m_data.deleter.m_device =
       (VkDevice)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3c8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       descriptorSetBuilder.m_writes.
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3c8.m_data.object.m_internal =
       (deUint64)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3c8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorSetBuilder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&descriptorSetBuilder);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&descriptorSetBuilder,this->m_device_interface,
             this->m_device,(VkCommandPool)local_3c8.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_578.m_data.deleter.m_device =
       (VkDevice)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_578.m_data.deleter.m_pool.m_internal =
       (deUint64)
       descriptorSetBuilder.m_writes.
       super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_578.m_data.object =
       (VkCommandBuffer_s *)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_578.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       descriptorSetBuilder.m_writeDescriptorInfos.
       super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  descriptorSetBuilder.m_writeDescriptorInfos.
  super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descriptorSetBuilder.m_writes.
  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&descriptorSetBuilder);
  beginCommandBuffer(this->m_device_interface,local_578.m_data.object);
  pDVar3 = this->m_device_interface;
  pVVar4 = this->m_device;
  pAVar5 = this->m_allocator;
  makeBufferCreateInfo((VkBufferCreateInfo *)&descriptorSetBuilder,this->m_bufferSize,0x120);
  compute::Buffer::Buffer
            (&indirectBuffer,pDVar3,pVVar4,pAVar5,(VkBufferCreateInfo *)&descriptorSetBuilder,
             (MemoryRequirement)0x1);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,local_578.m_data.object,&indirectBuffer);
  (*this->m_device_interface->_vptr_DeviceInterface[0x4c])
            (this->m_device_interface,local_578.m_data.object,1,local_388.m_data.object.m_internal);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(&descriptorSets,
           ((long)(this->m_dispatchCommands).
                  super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_dispatchCommands).
                 super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,
           (allocator_type *)&descriptorSetBuilder);
  bVar9 = true;
  VVar16 = 0;
  for (uVar18 = 0; uVar14 = (ulong)uVar18,
      uVar14 < (ulong)(((long)(this->m_dispatchCommands).
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_dispatchCommands).
                             super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar18 = uVar18 + 1
      ) {
    ptr = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
    makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&descriptorSetBuilder,
                      this->m_device_interface,this->m_device,
                      (VkDescriptorPool)local_3a8.m_data.object.m_internal,
                      (VkDescriptorSetLayout)local_4d8.m_data.object.m_internal);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
         (VkDevice)
         descriptorSetBuilder.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
         (deUint64)
         descriptorSetBuilder.m_writes.
         super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         (deUint64)
         descriptorSetBuilder.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         descriptorSetBuilder.m_writeDescriptorInfos.
         super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    descriptorSetBuilder.m_writeDescriptorInfos.
    super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    descriptorSetBuilder.m_writeDescriptorInfos.
    super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    descriptorSetBuilder.m_writeDescriptorInfos.
    super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    descriptorSetBuilder.m_writes.
    super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
               &resultDescriptorInfo,ptr);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
              (descriptorSets.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
               &resultDescriptorInfo);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
               &resultDescriptorInfo);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&descriptorSetBuilder);
    resultDescriptorInfo.buffer.m_internal =
         resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
         m_internal;
    resultDescriptorInfo.offset = VVar16;
    resultDescriptorInfo.range = VVar13;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&descriptorSetBuilder);
    local_530.m_binding = 0;
    local_530.m_arrayElement = 0;
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (&descriptorSetBuilder,
               (VkDescriptorSet)
               ((descriptorSets.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].m_ptr)->
               super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal,&local_530,
               VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&resultDescriptorInfo);
    ::vk::DescriptorSetUpdateBuilder::update
              (&descriptorSetBuilder,this->m_device_interface,this->m_device);
    (*this->m_device_interface->_vptr_DeviceInterface[0x56])
              (this->m_device_interface,local_578.m_data.object,1,local_488.m_data.object.m_internal
               ,0,1,descriptorSets.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14].m_ptr,0,0);
    (*this->m_device_interface->_vptr_DeviceInterface[0x5e])
              (this->m_device_interface,local_578.m_data.object,
               indirectBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,
               (this->m_dispatchCommands).
               super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].m_offset);
    VVar16 = VVar16 + VVar13;
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&descriptorSetBuilder);
  }
  (*this->m_device_interface->_vptr_DeviceInterface[0x6d])
            (this->m_device_interface,local_578.m_data.object,0x800,0x4000,0,0,0,1,&ssboPostBarrier,
             0,0);
  endCommandBuffer(this->m_device_interface,local_578.m_data.object);
  submitCommandsAndWait
            (this->m_device_interface,this->m_device,this->m_queue,local_578.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (this->m_device_interface,this->m_device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  pvVar6 = (resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  uVar18 = 0;
  ppWVar1 = &descriptorSetBuilder.m_writeDescriptorInfos.
             super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    uVar14 = (ulong)uVar18;
    pDVar7 = (this->m_dispatchCommands).
             super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_dispatchCommands).
                       super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar7) / 0x18) <= uVar14)
    break;
    if (*(int *)((long)pvVar6 + VVar13 * uVar14 + 0xc) !=
        (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
        (this->m_workGroupSize).m_data[2] * pDVar7[uVar14].m_numWorkGroups.m_data[0] *
        pDVar7[uVar14].m_numWorkGroups.m_data[1] * pDVar7[uVar14].m_numWorkGroups.m_data[2]) {
      descriptorSetBuilder.m_writeDescriptorInfos.
      super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this->m_context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppWVar1);
      std::operator<<((ostream *)ppWVar1,"ERROR: got invalid result for invocation ");
      std::ostream::_M_insert<unsigned_long>((ulong)ppWVar1);
      std::operator<<((ostream *)ppWVar1,": got numPassed = ");
      std::ostream::_M_insert<unsigned_long>((ulong)ppWVar1);
      std::operator<<((ostream *)ppWVar1,", expected ");
      std::ostream::_M_insert<unsigned_long>((ulong)ppWVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&descriptorSetBuilder,
                 (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppWVar1);
      bVar9 = false;
    }
    uVar18 = uVar18 + 1;
  }
  if (bVar9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptorSetBuilder,"Pass",(allocator<char> *)&resultDescriptorInfo);
    pTVar15 = local_550;
    local_550->m_code = QP_TEST_RESULT_PASS;
    std::__cxx11::string::string
              ((string *)&local_550->m_description,(string *)&descriptorSetBuilder);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptorSetBuilder,"Invalid values in result buffer",
               (allocator<char> *)&resultDescriptorInfo);
    pTVar15 = local_550;
    local_550->m_code = QP_TEST_RESULT_FAIL;
    std::__cxx11::string::string
              ((string *)&local_550->m_description,(string *)&descriptorSetBuilder);
  }
  std::__cxx11::string::~string((string *)&descriptorSetBuilder);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::~vector(&descriptorSets);
  compute::Buffer::~Buffer(&indirectBuffer);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_578);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_3c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_3a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_388);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_488);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_4d8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&layoutBuilder);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_468);
  compute::Buffer::~Buffer(&resultBuffer);
  return pTVar15;
}

Assistant:

tcu::TestStatus IndirectDispatchInstanceBufferUpload::iterate (void)
{
	tcu::TestContext& testCtx = m_context.getTestContext();

	testCtx.getLog() << tcu::TestLog::Message << "GL_DISPATCH_INDIRECT_BUFFER size = " << m_bufferSize << tcu::TestLog::EndMessage;
	{
		tcu::ScopedLogSection section(testCtx.getLog(), "Commands", "Indirect Dispatch Commands (" + de::toString(m_dispatchCommands.size()) + " in total)");

		for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
		{
			testCtx.getLog()
				<< tcu::TestLog::Message
				<< cmdNdx << ": " << "offset = " << m_dispatchCommands[cmdNdx].m_offset << ", numWorkGroups = " << m_dispatchCommands[cmdNdx].m_numWorkGroups
				<< tcu::TestLog::EndMessage;
		}
	}

	// Create result buffer
	const vk::VkDeviceSize resultBlockSize = getResultBlockAlignedSize(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), RESULT_BLOCK_BASE_SIZE);
	const vk::VkDeviceSize resultBufferSize = resultBlockSize * (deUint32)m_dispatchCommands.size();

	Buffer resultBuffer(
		m_device_interface, m_device, m_allocator,
		makeBufferCreateInfo(resultBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		vk::MemoryRequirement::HostVisible);

	{
		const vk::Allocation& alloc = resultBuffer.getAllocation();
		deUint8* resultDataPtr = reinterpret_cast<deUint8*>(alloc.getHostPtr());

		for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
		{
			deUint8* const	dstPtr = &resultDataPtr[resultBlockSize*cmdNdx];

			*(deUint32*)(dstPtr + 0 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[0];
			*(deUint32*)(dstPtr + 1 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[1];
			*(deUint32*)(dstPtr + 2 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[2];
			*(deUint32*)(dstPtr + RESULT_BLOCK_NUM_PASSED_OFFSET) = 0;
		}

		vk::flushMappedMemoryRange(m_device_interface, m_device, alloc.getMemory(), alloc.getOffset(), resultBufferSize);
	}

	// Create verify compute shader
	const vk::Unique<vk::VkShaderModule> verifyShader(createShaderModule(
		m_device_interface, m_device, m_context.getBinaryCollection().get("indirect_dispatch_" + m_name + "_verify"), 0u));

	// Create descriptorSetLayout
	vk::DescriptorSetLayoutBuilder layoutBuilder;
	layoutBuilder.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);
	vk::Unique<vk::VkDescriptorSetLayout> descriptorSetLayout(layoutBuilder.build(m_device_interface, m_device));

	// Create compute pipeline
	const vk::Unique<vk::VkPipelineLayout> pipelineLayout(makePipelineLayout(m_device_interface, m_device, *descriptorSetLayout));
	const vk::Unique<vk::VkPipeline> computePipeline(makeComputePipeline(m_device_interface, m_device, *pipelineLayout, *verifyShader));

	// Create descriptor pool
	const vk::Unique<vk::VkDescriptorPool> descriptorPool(
		vk::DescriptorPoolBuilder()
		.addType(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, (deUint32)m_dispatchCommands.size())
		.build(m_device_interface, m_device, vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, static_cast<deUint32>(m_dispatchCommands.size())));

	const vk::VkBufferMemoryBarrier ssboPostBarrier = makeBufferMemoryBarrier(
		vk::VK_ACCESS_SHADER_WRITE_BIT, vk::VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSize);

	// Create command buffer
	const vk::Unique<vk::VkCommandPool> cmdPool(makeCommandPool(m_device_interface, m_device, m_queueFamilyIndex));
	const vk::Unique<vk::VkCommandBuffer> cmdBuffer(allocateCommandBuffer(m_device_interface, m_device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Begin recording commands
	beginCommandBuffer(m_device_interface, *cmdBuffer);

	// Create indirect buffer
	Buffer indirectBuffer(
		m_device_interface, m_device, m_allocator,
		makeBufferCreateInfo(m_bufferSize, vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT | vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		vk::MemoryRequirement::HostVisible);
	fillIndirectBufferData(*cmdBuffer, indirectBuffer);

	// Bind compute pipeline
	m_device_interface.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	// Allocate descriptor sets
	typedef de::SharedPtr<vk::Unique<vk::VkDescriptorSet> > SharedVkDescriptorSet;
	std::vector<SharedVkDescriptorSet> descriptorSets(m_dispatchCommands.size());

	vk::VkDeviceSize curOffset = 0;

	// Create descriptor sets
	for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
	{
		descriptorSets[cmdNdx] = SharedVkDescriptorSet(new vk::Unique<vk::VkDescriptorSet>(
									makeDescriptorSet(m_device_interface, m_device, *descriptorPool, *descriptorSetLayout)));

		const vk::VkDescriptorBufferInfo resultDescriptorInfo = makeDescriptorBufferInfo(*resultBuffer, curOffset, resultBlockSize);

		vk::DescriptorSetUpdateBuilder descriptorSetBuilder;
		descriptorSetBuilder.writeSingle(**descriptorSets[cmdNdx], vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultDescriptorInfo);
		descriptorSetBuilder.update(m_device_interface, m_device);

		// Bind descriptor set
		m_device_interface.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &(**descriptorSets[cmdNdx]), 0u, DE_NULL);

		// Dispatch indirect compute command
		m_device_interface.cmdDispatchIndirect(*cmdBuffer, *indirectBuffer, m_dispatchCommands[cmdNdx].m_offset);

		curOffset += resultBlockSize;
	}

	// Insert memory barrier
	m_device_interface.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0,
										  0, (const vk::VkMemoryBarrier*)DE_NULL,
										  1, &ssboPostBarrier,
										  0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	// End recording commands
	endCommandBuffer(m_device_interface, *cmdBuffer);

	// Wait for command buffer execution finish
	submitCommandsAndWait(m_device_interface, m_device, m_queue, *cmdBuffer);

	// Check if result buffer contains valid values
	if (verifyResultBuffer(resultBuffer, resultBlockSize, resultBufferSize))
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Pass");
	else
		return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Invalid values in result buffer");
}